

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_creader_set_null(Curl_easy *data)

{
  Curl_creader *pCStack_20;
  CURLcode result;
  Curl_creader *r;
  Curl_easy *data_local;
  
  r = (Curl_creader *)data;
  data_local._4_4_ = Curl_creader_create(&stack0xffffffffffffffe0,data,&cr_null,CURL_CR_CLIENT);
  if (data_local._4_4_ == CURLE_OK) {
    cl_reset_reader((Curl_easy *)r);
    data_local._4_4_ = do_init_reader_stack((Curl_easy *)r,pCStack_20);
  }
  return data_local._4_4_;
}

Assistant:

CURLcode Curl_creader_set_null(struct Curl_easy *data)
{
  struct Curl_creader *r;
  CURLcode result;

  result = Curl_creader_create(&r, data, &cr_null, CURL_CR_CLIENT);
  if(result)
    return result;

  cl_reset_reader(data);
  return do_init_reader_stack(data, r);
}